

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

void Gia_ManIncrSimUpdate(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  Vec_Wrd_t *p_01;
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  Gia_Obj_t *pObj;
  word *pwVar5;
  word wVar6;
  int iVar7;
  int iVar8;
  
  p_00 = p->vTimeStamps;
  iVar7 = p_00->nSize;
  iVar2 = p->nObjs;
  if (iVar2 < iVar7) {
    __assert_fail("Vec_IntSize(p->vTimeStamps) <= Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x46f,"void Gia_ManIncrSimUpdate(Gia_Man_t *)");
  }
  if (iVar7 < iVar2) {
    iVar1 = p_00->nCap * 2;
    iVar8 = iVar2;
    if ((iVar1 < iVar2) || (iVar8 = iVar1, p_00->nCap < iVar2)) {
      Vec_IntGrow(p_00,iVar8);
      iVar7 = p_00->nSize;
    }
    for (lVar3 = (long)iVar7; lVar3 < iVar2; lVar3 = lVar3 + 1) {
      p_00->pArray[lVar3] = 0;
    }
    p_00->nSize = iVar2;
    iVar2 = p->nObjs;
  }
  p_01 = p->vSims;
  iVar7 = p_01->nSize;
  lVar3 = (long)iVar2 * (long)p->nSimWords;
  iVar2 = (int)lVar3;
  if (iVar7 <= iVar2) {
    if (iVar7 < iVar2) {
      iVar1 = p_01->nCap * 2;
      iVar8 = iVar2;
      if ((iVar1 < iVar2) || (iVar8 = iVar1, p_01->nCap < iVar2)) {
        Vec_WrdGrow(p_01,iVar8);
        iVar7 = p_01->nSize;
      }
      for (lVar4 = (long)iVar7; lVar4 < lVar3; lVar4 = lVar4 + 1) {
        p_01->pArray[lVar4] = 0;
      }
      p_01->nSize = iVar2;
    }
    iVar7 = p->iNextPi;
    iVar2 = p->vCis->nSize;
    if (iVar2 < iVar7) {
      __assert_fail("p->iNextPi <= Gia_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                    ,0x475,"void Gia_ManIncrSimUpdate(Gia_Man_t *)");
    }
    for (; iVar7 < iVar2; iVar7 = iVar7 + 1) {
      pObj = Gia_ManCi(p,iVar7);
      iVar2 = Gia_ObjId(p,pObj);
      pwVar5 = Gia_ManBuiltInData(p,iVar2);
      for (lVar3 = 0; lVar3 < p->nSimWords; lVar3 = lVar3 + 1) {
        wVar6 = Gia_ManRandomW(0);
        pwVar5[lVar3] = wVar6;
      }
      iVar2 = p->vCis->nSize;
    }
    p->iNextPi = iVar2;
    return;
  }
  __assert_fail("Vec_WrdSize(p->vSims) <= Gia_ManObjNum(p) * p->nSimWords",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                ,0x472,"void Gia_ManIncrSimUpdate(Gia_Man_t *)");
}

Assistant:

void Gia_ManIncrSimUpdate( Gia_Man_t * p )
{
    int i, k;
    // extend timestamp info
    assert( Vec_IntSize(p->vTimeStamps) <= Gia_ManObjNum(p) );
    Vec_IntFillExtra( p->vTimeStamps, Gia_ManObjNum(p), 0 );
    // extend simulation info
    assert( Vec_WrdSize(p->vSims) <= Gia_ManObjNum(p) * p->nSimWords );
    Vec_WrdFillExtra( p->vSims,  Gia_ManObjNum(p) * p->nSimWords,  0 );
    // extend PI info
    assert( p->iNextPi <= Gia_ManCiNum(p) );
    for ( i = p->iNextPi; i < Gia_ManCiNum(p); i++ )
    {
        word * pSims = Gia_ManBuiltInData( p, Gia_ManCiIdToId(p, i) );
        for ( k = 0; k < p->nSimWords; k++ )
            pSims[k] = Gia_ManRandomW(0);
    }
    p->iNextPi = Gia_ManCiNum(p);
}